

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
CivetServer::getListeningPorts
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,CivetServer *this)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  ulong local_50;
  size_t i;
  allocator<int> local_32;
  undefined1 local_31;
  undefined1 local_30 [8];
  vector<mg_server_port,_std::allocator<mg_server_port>_> server_ports;
  CivetServer *this_local;
  vector<int,_std::allocator<int>_> *ports;
  
  server_ports.super__Vector_base<mg_server_port,_std::allocator<mg_server_port>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  getListeningPortsFull((vector<mg_server_port,_std::allocator<mg_server_port>_> *)local_30,this);
  local_31 = 0;
  sVar2 = std::vector<mg_server_port,_std::allocator<mg_server_port>_>::size
                    ((vector<mg_server_port,_std::allocator<mg_server_port>_> *)local_30);
  std::allocator<int>::allocator(&local_32);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,sVar2,&local_32);
  std::allocator<int>::~allocator(&local_32);
  for (local_50 = 0;
      sVar2 = std::vector<mg_server_port,_std::allocator<mg_server_port>_>::size
                        ((vector<mg_server_port,_std::allocator<mg_server_port>_> *)local_30),
      local_50 < sVar2; local_50 = local_50 + 1) {
    pvVar3 = std::vector<mg_server_port,_std::allocator<mg_server_port>_>::operator[]
                       ((vector<mg_server_port,_std::allocator<mg_server_port>_> *)local_30,local_50
                       );
    iVar1 = pvVar3->port;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,local_50);
    *pvVar4 = iVar1;
  }
  local_31 = 1;
  std::vector<mg_server_port,_std::allocator<mg_server_port>_>::~vector
            ((vector<mg_server_port,_std::allocator<mg_server_port>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int>
CivetServer::getListeningPorts()
{
	std::vector<struct mg_server_port> server_ports = getListeningPortsFull();

	std::vector<int> ports(server_ports.size());
	for (size_t i = 0; i < server_ports.size(); i++) {
		ports[i] = server_ports[i].port;
	}

	return ports;
}